

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void make_happy_shk(monst *shkp,boolean silentkops)

{
  uint uVar1;
  boolean bVar2;
  xchar tolev;
  bool bVar3;
  int iVar4;
  obj *poVar5;
  monst *pmVar6;
  char *pcVar7;
  char shk_nam [256];
  char acStack_128 [256];
  
  uVar1 = *(uint *)&shkp->field_0x60;
  pacify_shk(shkp);
  *(undefined1 *)((long)&shkp[0x1b].meating + 1) = 0;
  shkp[0x1b].mtame = '\0';
  shkp[0x1b].m_ap_type = '\0';
  shkp[0x1b].mfrozen = '\0';
  shkp[0x1b].mblinded = '\0';
  if (urole.malenum != 0x164) {
    iVar4 = sgn((int)u.ualign.type);
    adjalign(iVar4);
  }
  iVar4 = inhishop(shkp);
  if (iVar4 == 0) {
    if (shkp->wormno == '\0') {
      if ((viz_array[shkp->my][shkp->mx] & 2U) != 0) goto LAB_0023a38f;
      if ((((u.uprops[0x1e].intrinsic != 0) ||
           (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
            (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
          ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
         ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0 &&
          (((youmonst.data)->mflags3 & 0x100) == 0)))) goto LAB_0023a3e9;
      bVar3 = false;
      if (((viz_array[shkp->my][shkp->mx] & 1U) != 0) && ((shkp->data->mflags3 & 0x200) != 0))
      goto LAB_0023a38f;
    }
    else {
      bVar2 = worm_known(level,shkp);
      if (bVar2 == '\0') {
LAB_0023a3e9:
        bVar3 = false;
      }
      else {
LAB_0023a38f:
        uVar1 = *(uint *)&shkp->field_0x60;
        if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((char)uVar1 < '\0') goto LAB_0023a3e9;
        }
        else {
          bVar3 = false;
          if (((char)uVar1 < '\0') || (((youmonst.data)->mflags1 & 0x1000000) == 0))
          goto LAB_0023a3eb;
        }
        bVar3 = (uVar1 >> 9 & 1) == 0 && (u._1052_1_ & 0x20) == 0;
      }
    }
LAB_0023a3eb:
    pcVar7 = mon_nam(shkp);
    strcpy(acStack_128,pcVar7);
    bVar2 = on_level((d_level *)&shkp[0x1b].mxlth,&shkp->dlevel->z);
    if (bVar2 == '\0') {
      if (((((shkp->data->mflags1 & 0x10000) == 0) &&
           ((poVar5 = which_armor(shkp,4), poVar5 == (obj *)0x0 ||
            (poVar5 = which_armor(shkp,4), poVar5->otyp != 0x4f)))) &&
          ((((u.uprops[0x1e].intrinsic != 0 ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
            (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
             ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
               (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
               youmonst.data == mons + 0x32 && (u.uprops[0x19].blocked == 0)))))) ||
           (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
            (iVar4 = dist2((int)shkp->mx,(int)shkp->my,(int)u.ux,(int)u.uy), iVar4 < 0x41)))))) ||
         (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
          (bVar2 = match_warn_of_mon(shkp), bVar2 != '\0')))) {
        bVar3 = true;
      }
      mdrop_special_objs(shkp);
      tolev = ledger_no((d_level *)&shkp[0x1b].mxlth);
      migrate_to_level(shkp,tolev,'\x01',(coord *)&shkp[0x1b].mintrinsics);
    }
    else {
      home_shk(shkp,'\0');
      if (shkp->wormno == '\0') {
        if (((viz_array[shkp->my][shkp->mx] & 2U) != 0) ||
           (((((u.uprops[0x1e].intrinsic == 0 &&
               ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
              (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
             ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
            (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
              (((youmonst.data)->mflags3 & 0x100) != 0)) &&
             (((viz_array[shkp->my][shkp->mx] & 1U) != 0 && ((shkp->data->mflags3 & 0x200) != 0)))))
            ))) goto LAB_0023a6ae;
      }
      else {
        bVar2 = worm_known(level,shkp);
        if (bVar2 != '\0') {
LAB_0023a6ae:
          uVar1 = *(uint *)&shkp->field_0x60;
          if ((((uVar1 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar1 & 0x280) == 0) goto LAB_0023a6f9;
          }
          else if (((uVar1 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_0023a6f9:
            bVar3 = (bool)((byte)u._1052_1_ >> 5 & bVar3);
          }
        }
      }
    }
    if (bVar3 == false) goto LAB_0023a71d;
    pcVar7 = "Satisfied, %s suddenly disappears!";
  }
  else {
    if ((uVar1 >> 0x16 & 1) != 0) goto LAB_0023a71d;
    Monnam(shkp);
    pcVar7 = "%s calms down.";
  }
  pline(pcVar7);
LAB_0023a71d:
  pmVar6 = level->monlist;
  while( true ) {
    pmVar6 = next_shkp(pmVar6,'\0');
    if (pmVar6 == (monst *)0x0) {
      kops_gone(silentkops);
      pacify_guards();
      return;
    }
    if ((pmVar6->field_0x62 & 0x40) == 0) break;
    pmVar6 = pmVar6->nmon;
  }
  return;
}

Assistant:

void make_happy_shk(struct monst *shkp, boolean silentkops)
{
	boolean wasmad = ANGRY(shkp);
	struct eshk *eshkp = ESHK(shkp);

	pacify_shk(shkp);
	eshkp->following = 0;
	eshkp->robbed = 0L;
	if (!Role_if (PM_ROGUE))
		adjalign(sgn(u.ualign.type));
	if (!inhishop(shkp)) {
		char shk_nam[BUFSZ];
		boolean vanished = canseemon(level, shkp);

		strcpy(shk_nam, mon_nam(shkp));
		if (on_level(&eshkp->shoplevel, &shkp->dlevel->z)) {
			home_shk(shkp, FALSE);
			/* didn't disappear if shk can still be seen */
			if (canseemon(level, shkp)) vanished = FALSE;
		} else {
			/* if sensed, does disappear regardless whether seen */
			if (sensemon(shkp)) vanished = TRUE;
			/* can't act as porter for the Amulet, even if shk
			   happens to be going farther down rather than up */
			mdrop_special_objs(shkp);
			/* arrive near shop's door */
			migrate_to_level(shkp, ledger_no(&eshkp->shoplevel),
					 MIGR_APPROX_XY, &eshkp->shd);
		}
		if (vanished)
		    pline("Satisfied, %s suddenly disappears!", shk_nam);
	} else if (wasmad)
		pline("%s calms down.", Monnam(shkp));

	if (!angry_shk_exists()) {
		kops_gone(silentkops);
		pacify_guards();
	}
}